

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

void __thiscall pbrt::syntactic::Material::~Material(Material *this)

{
  long in_RDI;
  
  std::__cxx11::string::~string((string *)(in_RDI + 0x60));
  std::__cxx11::string::~string((string *)(in_RDI + 0x40));
  std::shared_ptr<pbrt::syntactic::Attributes>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::Attributes> *)0x1c9d68);
  ParamSet::~ParamSet((ParamSet *)0x1c9d72);
  return;
}

Assistant:

struct PBRT_PARSER_INTERFACE Material : public ParamSet {
      /*! a "Type::SP" shorthand for std::shared_ptr<Type> - makes code
        more concise, and easier to read */
      typedef std::shared_ptr<Material> SP;

      /*! constructor */
      Material(const std::string &type) : type(type) {};

      /*! pretty-print this material (for debugging) */
      std::string toString() const;

      Attributes::SP attributes;
    
      /*! the 'type' of the material, such as 'uber'material, 'matte',
        'mix' etc. Note that the PBRT format has two inconsistent
        ways of specifying that type: for the 'Material' command it
        specifies the type explicitly right after the 'matierla'
        command; for the 'makenamedmaterial' it uses an implicit
        'type' parameter */
      std::string type;

      /*! the logical name that this was defined under, such as
        "BackWall". Note this may be an empty string for some scenes
        (it is only defined for 'NamedMaterial's) */
      std::string name;
    }